

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O2

void __thiscall HoldingProperty_CopyOwner_Test::TestBody(HoldingProperty_CopyOwner_Test *this)

{
  char *pcVar1;
  AssertHelper local_218;
  AssertionResult gtest_ar_4;
  AssertHelper local_200;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  HoldingProperty<BasicHoldingProperties,_int,_2UL,_prop::ReadOnly> local_1d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  HoldingProperty<BasicHoldingProperties,_long_long,_5UL,_prop::ReadWrite> local_188;
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  string local_160 [32];
  undefined1 local_140 [48];
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  HoldingProperty<BasicHoldingProperties,_long_long,_5UL,_prop::ReadWrite> local_d0;
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  BasicHoldingProperties obj;
  
  local_140._8_8_ = local_140 + 0x18;
  local_140._16_8_ = 0;
  local_140[0x18] = '\0';
  local_110._M_p = (pointer)&local_100;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0.super_PropertyHoldingBase<long_long>.m_value = (PropertyHoldingBase<long_long>)0;
  local_c8._M_p = (pointer)&local_b8;
  local_b8._M_allocated_capacity = 0;
  local_b8._8_8_ = 0;
  local_c0 = 0;
  local_140._0_4_ = 5;
  local_140._40_4_ = 6;
  std::__cxx11::string::assign(local_140 + 8);
  std::__cxx11::string::string(local_160,"bill",(allocator *)&obj);
  std::__cxx11::string::_M_assign((string *)&local_110);
  std::__cxx11::string::~string(local_160);
  BasicHoldingProperties::BasicHoldingProperties(&obj,(BasicHoldingProperties *)local_140);
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"5","obj.int_value()",(int *)&gtest_ar_4,(int *)&obj);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x19b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"6","obj.ro_int_value()",(int *)&gtest_ar_4,
             (int *)&obj.ro_int_value);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x19c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"bob\"","obj.string_value()",(char (*) [4])"bob",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj.string_value)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x19d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"bill\"","obj.ro_string_value()",(char (*) [5])"bill",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &obj.ro_string_value);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x19e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0;
  local_1e0._M_local_buf[0] = '\0';
  local_1d0[0].super_PropertyHoldingBase<int>.m_value = (PropertyHoldingBase<int>)0;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1a8._M_p = (pointer)&local_198;
  local_1a0 = 0;
  local_198._M_local_buf[0] = '\0';
  local_188.super_PropertyHoldingBase<long_long>.m_value = (PropertyHoldingBase<long_long>)0;
  local_180._M_p = (pointer)&local_170;
  local_170._M_allocated_capacity = 0;
  local_170._8_8_ = 0;
  local_178 = 0;
  gtest_ar.success_ = false;
  gtest_ar._1_3_ = 0;
  pcVar1 = "";
  std::__cxx11::string::assign((char *)&gtest_ar.message_);
  BasicHoldingProperties::operator=
            ((BasicHoldingProperties *)&gtest_ar,(BasicHoldingProperties *)local_140);
  local_218.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_4,"5","obj2.int_value()",(int *)&local_218,(int *)&gtest_ar);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_218);
    if (gtest_ar_4.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x1a4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_218);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  local_218.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_4,"6","obj2.ro_int_value()",(int *)&local_218,(int *)local_1d0);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_218);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x1a5,pcVar1);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_218);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar_4,"\"bob\"","obj2.string_value()",(char (*) [4])"bob",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_218);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x1a6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_218);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar_4,"\"bill\"","obj2.ro_string_value()",(char (*) [5])"bill",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1d0 + 2));
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_218);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x1a7,pcVar1);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_218);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  BasicHoldingProperties::~BasicHoldingProperties((BasicHoldingProperties *)&gtest_ar);
  BasicHoldingProperties::~BasicHoldingProperties(&obj);
  BasicHoldingProperties::~BasicHoldingProperties((BasicHoldingProperties *)local_140);
  return;
}

Assistant:

TEST(HoldingProperty, GetConvertValue)
{
  BasicHoldingProperties obj;

  int int_value = obj.int_value;
  int ro_int_value = obj.ro_int_value;
  std::string string_value = obj.string_value;
  std::string ro_string_value = obj.ro_string_value;
  
  EXPECT_EQ( 0, int_value );
  EXPECT_EQ( 0, ro_int_value );
  EXPECT_EQ( "", string_value );
  EXPECT_EQ( "", ro_string_value );
  
  obj.setIntValue( 86 );
  obj.setStringValue( "bob" );
  obj.setROIntValue( 53 );
  obj.setROStringValue( "bill" );
  
  int_value = obj.int_value;
  ro_int_value = obj.ro_int_value;
  string_value = obj.string_value;
  ro_string_value = obj.ro_string_value;
  
  EXPECT_EQ( 86, int_value );
  EXPECT_EQ( 53, ro_int_value );
  EXPECT_EQ( "bob", string_value );
  EXPECT_EQ( "bill", ro_string_value );
  
  long long long_value = obj.int_value;
  long long ro_long_value = obj.ro_int_value;
  
  EXPECT_EQ( 86, long_value );
  EXPECT_EQ( 53, ro_long_value );
  
  StringHolder holder;
  holder = obj.string_value;
  EXPECT_EQ( "bob", holder.string );
}